

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_opldumper_mididevice.cpp
# Opt level: O1

void __thiscall OPL_RDOSdump::SetClockRate(OPL_RDOSdump *this,double samples_per_tick)

{
  int iVar1;
  double dVar2;
  WORD clock_word;
  BYTE clock_change [4];
  undefined1 local_16 [2];
  undefined1 local_14 [4];
  
  (this->super_OPLDump).TimePerTick = samples_per_tick * 0.020114248933944805;
  iVar1 = 1;
  do {
    dVar2 = (double)iVar1;
    iVar1 = iVar1 + 1;
  } while (65535.0 < (samples_per_tick * 24.0) / dVar2 + 0.5);
  if ((this->super_OPLDump).field_0x29 == '\x01') {
    fseek((FILE *)(this->super_OPLDump).File,8,0);
    fwrite(local_16,2,1,(FILE *)(this->super_OPLDump).File);
    fseek((FILE *)(this->super_OPLDump).File,0,2);
    (this->super_OPLDump).field_0x29 = 0;
  }
  else {
    fwrite(local_14,1,4,(FILE *)(this->super_OPLDump).File);
  }
  return;
}

Assistant:

virtual void SetClockRate(double samples_per_tick)
	{
		TimePerTick = samples_per_tick / OPL_SAMPLE_RATE * 1000.0;

		double clock_rate;
		int clock_mul;
		WORD clock_word;

		clock_rate = samples_per_tick * ADLIB_CLOCK_MUL;
		clock_mul = 1;

		// The RDos raw format's clock rate is stored in a word. Therefore,
		// the longest tick that can be stored is only ~55 ms.
		while (clock_rate / clock_mul + 0.5 > 65535.0)
		{
			clock_mul++;
		}
		clock_word = WORD(clock_rate / clock_mul + 0.5);

		if (NeedClockRate)
		{ // Set the initial clock rate.
			clock_word = LittleShort(clock_word);
			fseek(File, 8, SEEK_SET);
			fwrite(&clock_word, 2, 1, File);
			fseek(File, 0, SEEK_END);
			NeedClockRate = false;
		}
		else
		{ // Change the clock rate in the middle of the song.
			BYTE clock_change[4] = { 0, 2, BYTE(clock_word & 255), BYTE(clock_word >> 8) };
			fwrite(clock_change, 1, 4, File);
		}
	}